

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O1

bool __thiscall RenX::Server::removePlayer(Server *this,int id)

{
  list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *this_00;
  pointer ppPVar1;
  Core *this_01;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *pvVar2;
  bool bVar3;
  pointer ppPVar4;
  iterator __position;
  
  if ((this->players).super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>._M_impl.
      _M_node._M_size == 0) {
    bVar3 = false;
  }
  else {
    this_00 = &this->players;
    __position._M_node = (_List_node_base *)this_00;
    do {
      __position._M_node = (__position._M_node)->_M_next;
      bVar3 = __position._M_node != (_List_node_base *)this_00;
      if (__position._M_node == (_List_node_base *)this_00) {
        return bVar3;
      }
    } while (*(int *)((long)&__position._M_node[0x10]._M_prev + 4) != id);
    this_01 = getCore();
    pvVar2 = Core::getPlugins(this_01);
    ppPVar4 = (pvVar2->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppPVar1 = (pvVar2->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppPVar4 != ppPVar1) {
      do {
        (**(code **)(*(long *)*ppPVar4 + 0xf8))(*ppPVar4,this,__position._M_node + 1);
        ppPVar4 = ppPVar4 + 1;
      } while (ppPVar4 != ppPVar1);
    }
    if (*(char *)&__position._M_node[0x11]._M_next != '\0') {
      this->m_bot_count = this->m_bot_count - 1;
    }
    if (*(char *)&__position._M_node[0x17]._M_prev == '\x01') {
      this->m_player_rdns_resolutions_pending = this->m_player_rdns_resolutions_pending - 1;
    }
    std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::_M_erase
              (this_00,__position);
  }
  return bVar3;
}

Assistant:

bool RenX::Server::removePlayer(int id) {
	if (this->players.size() == 0) {
		return false;
	}

	for (auto node = this->players.begin(); node != this->players.end(); ++node) {
		if (node->id == id) {
			for (auto plugin : RenX::getCore()->getPlugins()) {
				plugin->RenX_OnPlayerDelete(*this, *node);
			}

			if (node->isBot) {
				--m_bot_count;
			}

			if (node->rdns_pending) {
				--m_player_rdns_resolutions_pending;
			}

			this->players.erase(node);
			return true;
		}
	}

	return false;
}